

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryFile.hpp
# Opt level: O0

void __thiscall supermap::io::TemporaryFile::~TemporaryFile(TemporaryFile *this)

{
  path *this_00;
  string *in_RDI;
  format in_stack_00000017;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  path *in_stack_00000020;
  undefined1 local_30 [48];
  
  if (((byte)in_RDI[0x30] & 1) == 0) {
    this_00 = (path *)std::
                      __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x155b37);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (in_stack_00000020,in_stack_00000018,in_stack_00000017);
    (*(*(_func_int ***)&this_00->_M_pathname)[2])(this_00,local_30);
    std::filesystem::__cxx11::path::~path(this_00);
  }
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x155b7f);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~TemporaryFile() {
        if (!canceledDeletion_) {
            manager_->remove(path_);
        }
    }